

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

Optional<unsigned_long> __thiscall
llvm::DWARFUnit::getStringOffsetSectionItem(DWARFUnit *this,uint32_t Index)

{
  byte bVar1;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  Optional<unsigned_long> OVar4;
  undefined1 auStack_48 [8];
  DWARFDataExtractor DA;
  uint64_t Offset;
  
  if ((this->StringOffsetsTableContribution).Storage.hasVal == true) {
    bVar1 = getDwarfStringOffsetsByteSize(this);
    if ((this->StringOffsetsTableContribution).Storage.hasVal == false) {
      __assert_fail("StringOffsetsTableContribution",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFUnit.h"
                    ,0x155,"uint64_t llvm::DWARFUnit::getStringOffsetsBase() const");
    }
    DA.Section = (DWARFSection *)
                 ((ulong)(Index * bVar1) +
                 (this->StringOffsetsTableContribution).Storage.field_0.value.Base);
    DA.Obj = (DWARFObject *)this->StringOffsetSection;
    if ((char *)((long)&((DA.Section)->Data).Data + (ulong)(uint)bVar1) <=
        ((DA.Obj)->Dummy).Data.Data) {
      DA.super_DataExtractor._16_8_ =
           (this->Context->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      DA.super_DataExtractor.Data.Length._0_1_ = this->isLittleEndian;
      auStack_48 = (undefined1  [8])((StringRef *)&(DA.Obj)->_vptr_DWARFObject)->Data;
      DA.super_DataExtractor.Data.Data = ((DA.Obj)->Dummy).Data.Data;
      DA.super_DataExtractor.Data.Length._1_1_ = 0;
      aVar2.value = DWARFDataExtractor::getRelocatedValue
                              ((DWARFDataExtractor *)auStack_48,(uint)bVar1,(uint64_t *)&DA.Section,
                               (uint64_t *)0x0,(Error *)0x0);
      uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_00b127a2;
    }
  }
  uVar3 = 0;
  aVar2.value = 0;
LAB_00b127a2:
  OVar4.Storage._8_8_ = uVar3;
  OVar4.Storage.field_0.value = aVar2.value;
  return (Optional<unsigned_long>)OVar4.Storage;
}

Assistant:

Optional<uint64_t> DWARFUnit::getStringOffsetSectionItem(uint32_t Index) const {
  if (!StringOffsetsTableContribution)
    return None;
  unsigned ItemSize = getDwarfStringOffsetsByteSize();
  uint64_t Offset = getStringOffsetsBase() + Index * ItemSize;
  if (StringOffsetSection.Data.size() < Offset + ItemSize)
    return None;
  DWARFDataExtractor DA(Context.getDWARFObj(), StringOffsetSection,
                        isLittleEndian, 0);
  return DA.getRelocatedValue(ItemSize, &Offset);
}